

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangen.c
# Opt level: O3

int setup_time(void)

{
  uint uVar1;
  char *__s;
  timespec ts2;
  
  if (use_so_txtime == '\x01') {
    if (ts.tv_nsec != 0 || ts.tv_sec != 0) {
      return 0;
    }
    uVar1 = clock_gettime(0xb,(timespec *)&ts);
    if (uVar1 == 0) {
      ts2.tv_nsec = ts_gap.tv_nsec;
      ts2.tv_sec = ts_gap.tv_sec;
      ts = timespec_add(ts,ts2);
      return 0;
    }
  }
  else {
    if (ts.tv_nsec != 0 || ts.tv_sec != 0) {
      uVar1 = clock_nanosleep(0xb,1,(timespec *)&ts,(timespec *)0x0);
      if ((uVar1 & 0xfffffffb) == 0) {
        if (clock_nanosleep_flags != '\0') {
          return 0;
        }
LAB_001030be:
        ts.tv_nsec = ts_gap.tv_nsec;
        ts.tv_sec = ts_gap.tv_sec;
        return 0;
      }
      __s = "clock_nanosleep";
      goto LAB_001030e0;
    }
    if (clock_nanosleep_flags != '\x01') goto LAB_001030be;
    uVar1 = clock_gettime(0xb,(timespec *)&ts);
    if (uVar1 == 0) {
      return 0;
    }
  }
  __s = "clock_gettime";
LAB_001030e0:
  perror(__s);
  return uVar1;
}

Assistant:

static int setup_time(void)
{
	int ret;

	if (use_so_txtime) {
		/* start time is defined */
		if (ts.tv_sec || ts.tv_nsec)
			return 0;

		/* start time is now .... */
		ret = clock_gettime(clockid, &ts);
		if (ret) {
			perror("clock_gettime");
			return ret;
		}

		/* ... + gap */
		ts = timespec_add(ts, ts_gap);

		return 0;
	}

	if (ts.tv_sec || ts.tv_nsec) {
		ret = clock_nanosleep(clockid, TIMER_ABSTIME, &ts, NULL);
		if (ret != 0 && ret != EINTR) {
			perror("clock_nanosleep");
			return ret;
		}
	} else if (clock_nanosleep_flags == TIMER_ABSTIME) {
		ret = clock_gettime(clockid, &ts);
		if (ret)
			perror("clock_gettime");

		return ret;
	}

	if (clock_nanosleep_flags != TIMER_ABSTIME)
		ts = ts_gap;

	return 0;
}